

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O1

void __thiscall gv_visitor::visit(gv_visitor *this,MoreThanOneMethodArgs *ptr)

{
  pointer ppMVar1;
  Method_arg *second;
  pointer ppMVar2;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"mnogo args","");
  box(this,ptr,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  ppMVar1 = (ptr->super_Method_args).args.
            super__Vector_base<Method_arg_*,_std::allocator<Method_arg_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppMVar2 = (ptr->super_Method_args).args.
                 super__Vector_base<Method_arg_*,_std::allocator<Method_arg_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppMVar2 != ppMVar1; ppMVar2 = ppMVar2 + 1) {
    second = *ppMVar2;
    arrow(this,ptr,second);
    (**(second->super_Base)._vptr_Base)(second,this);
  }
  return;
}

Assistant:

void gv_visitor::visit(MoreThanOneMethodArgs* ptr) {
    box(ptr, "mnogo args");
    for(auto i : ptr->args) {
        arrow(ptr, i);
        i->accept(this);
    }
}